

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O3

QCborValue * __thiscall
QCborArray::extract(QCborValue *__return_storage_ptr__,QCborArray *this,iterator it)

{
  detach(this,0);
  *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborContainerPrivate::extractAt
            (__return_storage_ptr__,(this->d).d.ptr,it.item.super_QCborValueConstRef.i);
  QCborContainerPrivate::removeAt((this->d).d.ptr,it.item.super_QCborValueConstRef.i);
  return __return_storage_ptr__;
}

Assistant:

QCborValue QCborArray::extract(iterator it)
{
    detach();

    QCborValue v = d->extractAt(it.item.i);
    d->removeAt(it.item.i);
    return v;
}